

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

int sat_solver3_decision(sat_solver3 *s,lit l)

{
  int iVar1;
  lit l_local;
  sat_solver3 *s_local;
  
  if (s->qtail != s->qhead) {
    __assert_fail("s->qtail == s->qhead",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                  ,0x278,"int sat_solver3_decision(sat_solver3 *, lit)");
  }
  iVar1 = lit_var(l);
  iVar1 = var_value(s,iVar1);
  if (iVar1 == 3) {
    veci_push(&s->trail_lim,s->qtail);
    iVar1 = sat_solver3_enqueue(s,l,0);
    return iVar1;
  }
  __assert_fail("var_value(s, lit_var(l)) == varX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                ,0x279,"int sat_solver3_decision(sat_solver3 *, lit)");
}

Assistant:

static inline int sat_solver3_decision(sat_solver3* s, lit l){
    assert(s->qtail == s->qhead);
    assert(var_value(s, lit_var(l)) == varX);
#ifdef VERBOSEDEBUG
    printf(L_IND"assume("L_LIT")  ", L_ind, L_lit(l));
    printf( "act = %.20f\n", s->activity[lit_var(l)] );
#endif
    veci_push(&s->trail_lim,s->qtail);
    return sat_solver3_enqueue(s,l,0);
}